

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCDATASectionImpl.cpp
# Opt level: O2

DOMText * __thiscall
xercesc_4_0::DOMCDATASectionImpl::splitText(DOMCDATASectionImpl *this,XMLSize_t offset)

{
  ulong uVar1;
  DOMBuffer *pDVar2;
  XMLSize_t XVar3;
  int iVar4;
  undefined4 extraout_var;
  DOMNode *startNode;
  long *plVar5;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_00;
  DOMRangeImpl *this_01;
  undefined4 extraout_var_01;
  DOMException *this_02;
  undefined4 extraout_var_02;
  undefined8 *puVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar7;
  XMLSize_t i;
  XMLSize_t getAt;
  undefined4 extraout_var_00;
  
  if (((this->fNode).flags & 1) == 0) {
    uVar1 = ((this->fCharacterData).fDataBuf)->fIndex;
    if (offset <= uVar1) {
      iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])(this);
      plVar7 = (long *)(CONCAT44(extraout_var,iVar4) + -8);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        plVar7 = (long *)0x0;
      }
      iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0x2a])(this,offset,uVar1 - offset);
      startNode = (DOMNode *)(**(code **)(*plVar7 + 0x198))(plVar7,iVar4);
      iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[5])(this);
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
      if (plVar5 != (long *)0x0) {
        iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                  _vptr_DOMNode[10])(this);
        (**(code **)(*plVar5 + 0x70))(plVar5,startNode,iVar4);
      }
      pDVar2 = (this->fCharacterData).fDataBuf;
      pDVar2->fBuffer[offset] = L'\0';
      pDVar2->fIndex = offset;
      this_00 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)(**(code **)(*plVar7 + 0x230))(plVar7)
      ;
      if ((this_00 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0) &&
         (XVar3 = this_00->fCurCount, XVar3 != 0)) {
        for (getAt = 0; XVar3 != getAt; getAt = getAt + 1) {
          this_01 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_00,getAt);
          DOMRangeImpl::updateSplitInfo(this_01,(DOMNode *)this,startNode,offset);
        }
      }
      return (DOMText *)startNode;
    }
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_02,iVar4) == 0) {
      puVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])(this);
      puVar6 = (undefined8 *)(CONCAT44(extraout_var_04,iVar4) + 0x158);
    }
    DOMException::DOMException(this_02,1,0,(MemoryManager *)*puVar6);
  }
  else {
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
              _vptr_DOMNode[0xc])(this);
    if (CONCAT44(extraout_var_01,iVar4) == 0) {
      puVar6 = &XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar4 = (*(this->super_DOMCDATASection).super_DOMText.super_DOMCharacterData.super_DOMNode.
                _vptr_DOMNode[0xc])(this);
      puVar6 = (undefined8 *)(CONCAT44(extraout_var_03,iVar4) + 0x158);
    }
    DOMException::DOMException(this_02,7,0,(MemoryManager *)*puVar6);
  }
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMText *DOMCDATASectionImpl::splitText(XMLSize_t offset)
{
    if (fNode.isReadOnly())
    {
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    }
    XMLSize_t len = fCharacterData.fDataBuf->getLen();
    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMNodeMemoryManager);

    DOMDocumentImpl *doc = (DOMDocumentImpl *)getOwnerDocument();
    DOMText *newText =
      doc->createCDATASection(this->substringData(offset, len - offset));

    DOMNode *parent = getParentNode();
    if (parent != 0)
        parent->insertBefore(newText, getNextSibling());

    fCharacterData.fDataBuf->chop(offset);

    if (doc != 0) {
        Ranges* ranges = doc->getRanges();
        if (ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateSplitInfo( this, newText, offset);
                }
            }
        }
    }

    return newText;
}